

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O1

int demoWrite(unqlite_file *pFile,void *zBuf,unqlite_int64 iAmt,unqlite_int64 iOfst)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int unaff_EBP;
  size_t __n;
  
  if (pFile[3].pMethods == (unqlite_io_methods *)0x0) {
    iVar2 = demoDirectWrite((DemoFile *)pFile,zBuf,(int)iAmt,iOfst);
    return iVar2;
  }
  do {
    if (iAmt < 1) {
      return 0;
    }
    iVar2 = *(int *)&pFile[4].pMethods;
    if ((long)iVar2 == 0x2000) {
LAB_0010aad0:
      iVar2 = demoDirectWrite((DemoFile *)pFile,pFile[3].pMethods,iVar2,
                              (unqlite_int64)pFile[5].pMethods);
      *(undefined4 *)&pFile[4].pMethods = 0;
LAB_0010aaeb:
      if (iVar2 == 0) goto LAB_0010aaf6;
      bVar1 = false;
      unaff_EBP = iVar2;
    }
    else {
      if ((long)&(pFile[5].pMethods)->iVersion + (long)iVar2 != iOfst) {
        if (iVar2 != 0) goto LAB_0010aad0;
        iVar2 = 0;
        goto LAB_0010aaeb;
      }
LAB_0010aaf6:
      lVar3 = (long)*(int *)&pFile[4].pMethods;
      if ((lVar3 != 0) && ((long)&(pFile[5].pMethods)->iVersion + lVar3 != iOfst)) {
        __assert_fail("p->nBuffer==0 || p->iBufferOfst+p->nBuffer==i",
                      "/workspace/llm4binary/github/license_c_cmakelists/symisc[P]unqlite/example/demovfs/unqlite_demovfs.c"
                      ,0x121,
                      "int demoWrite(unqlite_file *, const void *, unqlite_int64, unqlite_int64)");
      }
      iVar2 = (int)iAmt;
      if (0x2000 - lVar3 <= iAmt) {
        iVar2 = (int)(0x2000 - lVar3);
      }
      pFile[5].pMethods = (unqlite_io_methods *)(iOfst - lVar3);
      __n = (size_t)iVar2;
      memcpy((void *)((long)&(pFile[3].pMethods)->iVersion + lVar3),zBuf,__n);
      *(int *)&pFile[4].pMethods = *(int *)&pFile[4].pMethods + iVar2;
      iAmt = iAmt - __n;
      iOfst = iOfst + __n;
      zBuf = (void *)((long)zBuf + __n);
      bVar1 = true;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int demoWrite(
  unqlite_file *pFile, 
  const void *zBuf,
#if defined(_MSC_VER) || defined(__MINGW32__)
  int iAmt,
#else
  unqlite_int64 iAmt,
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
  unqlite_int64 iOfst
){
  DemoFile *p = (DemoFile*)pFile;
  
  if( p->aBuffer ){
    char *z = (char *)zBuf;       /* Pointer to remaining data to write */
#if defined(_MSC_VER) || defined(__MINGW32__)
    int n = iAmt;                  /* Number of bytes at z */
#else
    unqlite_int64 n = iAmt;       /* Number of bytes at z */
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
    unqlite_int64 i = iOfst;      /* File offset to write to */

    while( n>0 ){
      int nCopy;                  /* Number of bytes to copy into buffer */

      /* If the buffer is full, or if this data is not being written directly
      ** following the data already buffered, flush the buffer. Flushing
      ** the buffer is a no-op if it is empty.  
      */
      if( p->nBuffer==UNQLITE_DEMOVFS_BUFFERSZ || p->iBufferOfst+p->nBuffer!=i ){
        int rc = demoFlushBuffer(p);
        if( rc!=UNQLITE_OK ){
          return rc;
        }
      }
      assert( p->nBuffer==0 || p->iBufferOfst+p->nBuffer==i );
      p->iBufferOfst = i - p->nBuffer;

      /* Copy as much data as possible into the buffer. */
      nCopy = UNQLITE_DEMOVFS_BUFFERSZ - p->nBuffer;
      if( nCopy>n ){
        nCopy = n;
      }
      memcpy(&p->aBuffer[p->nBuffer], z, nCopy);
      p->nBuffer += nCopy;

      n -= nCopy;
      i += nCopy;
      z += nCopy;
    }
  }else{
    return demoDirectWrite(p, zBuf, iAmt, iOfst);
  }

  return UNQLITE_OK;
}